

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O2

void testRoundingError(void)

{
  anon_unknown.dwarf_fdd22::testNormalizedRounding(10);
  anon_unknown.dwarf_fdd22::testDenormalizedRounding(10);
  anon_unknown.dwarf_fdd22::testNormalizedRounding(9);
  anon_unknown.dwarf_fdd22::testDenormalizedRounding(9);
  anon_unknown.dwarf_fdd22::testNormalizedRounding(1);
  anon_unknown.dwarf_fdd22::testDenormalizedRounding(1);
  anon_unknown.dwarf_fdd22::testNormalizedRounding(0);
  anon_unknown.dwarf_fdd22::testDenormalizedRounding(0);
  return;
}

Assistant:

void
testRoundingError ()
{
    testNormalizedRounding (10);
    testDenormalizedRounding (10);
    testNormalizedRounding (9);
    testDenormalizedRounding (9);
    testNormalizedRounding (1);
    testDenormalizedRounding (1);
    testNormalizedRounding (0);
    testDenormalizedRounding (0);
}